

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O2

void sfnt_done_face(TT_Face face)

{
  FT_Memory memory;
  void *pvVar1;
  
  if (face != (TT_Face)0x0) {
    memory = (face->root).memory;
    pvVar1 = face->sfnt;
    if (pvVar1 != (void *)0x0) {
      if (*(code **)((long)pvVar1 + 0xa0) != (code *)0x0) {
        (**(code **)((long)pvVar1 + 0xa0))(face);
      }
      if (*(code **)((long)pvVar1 + 200) != (code *)0x0) {
        (**(code **)((long)pvVar1 + 200))(face);
      }
    }
    if ((face->bdf).loaded != '\0') {
      if ((face->bdf).table != (FT_Byte *)0x0) {
        FT_Stream_ReleaseFrame((face->root).stream,&(face->bdf).table);
      }
      (face->bdf).table_end = (FT_Byte *)0x0;
      (face->bdf).strings = (FT_Byte *)0x0;
      (face->bdf).strings_size = 0;
    }
    FT_Stream_ReleaseFrame((face->root).stream,&face->kern_table);
    face->kern_table_size = 0;
    face->num_kern_tables = 0;
    face->kern_avail_bits = 0;
    face->kern_order_bits = 0;
    ft_mem_free(memory,(face->ttc_header).offsets);
    (face->ttc_header).count = 0;
    (face->ttc_header).offsets = (FT_ULong *)0x0;
    ft_mem_free(memory,face->dir_tables);
    face->dir_tables = (TT_Table)0x0;
    face->num_tables = 0;
    FT_Stream_ReleaseFrame((face->root).stream,&face->cmap_table);
    face->cmap_size = 0;
    face->horz_metrics_size = 0;
    face->vert_metrics_size = 0;
    if (face->vertical_info != '\0') {
      ft_mem_free(memory,(face->vertical).long_metrics);
      (face->vertical).long_metrics = (void *)0x0;
      ft_mem_free(memory,(face->vertical).short_metrics);
      (face->vertical).short_metrics = (void *)0x0;
      face->vertical_info = '\0';
    }
    ft_mem_free(memory,(face->gasp).gaspRanges);
    (face->gasp).gaspRanges = (TT_GaspRange)0x0;
    (face->gasp).numRanges = 0;
    if (pvVar1 != (void *)0x0) {
      (**(code **)((long)pvVar1 + 0x68))(face);
    }
    ft_mem_free(memory,(face->root).family_name);
    (face->root).family_name = (FT_String *)0x0;
    ft_mem_free(memory,(face->root).style_name);
    (face->root).style_name = (FT_String *)0x0;
    ft_mem_free(memory,(face->root).available_sizes);
    (face->root).available_sizes = (FT_Bitmap_Size *)0x0;
    ft_mem_free(memory,face->sbit_strike_map);
    face->sbit_strike_map = (FT_UInt *)0x0;
    (face->root).num_fixed_sizes = 0;
    ft_mem_free(memory,face->postscript_name);
    face->postscript_name = (char *)0x0;
    ft_mem_free(memory,face->var_postscript_prefix);
    face->var_postscript_prefix = (char *)0x0;
    face->sfnt = (void *)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  sfnt_done_face( TT_Face  face )
  {
    FT_Memory     memory;
    SFNT_Service  sfnt;


    if ( !face )
      return;

    memory = face->root.memory;
    sfnt   = (SFNT_Service)face->sfnt;

    if ( sfnt )
    {
      /* destroy the postscript names table if it is loaded */
      if ( sfnt->free_psnames )
        sfnt->free_psnames( face );

      /* destroy the embedded bitmaps table if it is loaded */
      if ( sfnt->free_eblc )
        sfnt->free_eblc( face );
    }

#ifdef TT_CONFIG_OPTION_BDF
    /* freeing the embedded BDF properties */
    tt_face_free_bdf_props( face );
#endif

    /* freeing the kerning table */
    tt_face_done_kern( face );

    /* freeing the collection table */
    FT_FREE( face->ttc_header.offsets );
    face->ttc_header.count = 0;

    /* freeing table directory */
    FT_FREE( face->dir_tables );
    face->num_tables = 0;

    {
      FT_Stream  stream = FT_FACE_STREAM( face );


      /* simply release the 'cmap' table frame */
      FT_FRAME_RELEASE( face->cmap_table );
      face->cmap_size = 0;
    }

    face->horz_metrics_size = 0;
    face->vert_metrics_size = 0;

    /* freeing vertical metrics, if any */
    if ( face->vertical_info )
    {
      FT_FREE( face->vertical.long_metrics  );
      FT_FREE( face->vertical.short_metrics );
      face->vertical_info = 0;
    }

    /* freeing the gasp table */
    FT_FREE( face->gasp.gaspRanges );
    face->gasp.numRanges = 0;

    /* freeing the name table */
    if ( sfnt )
      sfnt->free_name( face );

    /* freeing family and style name */
    FT_FREE( face->root.family_name );
    FT_FREE( face->root.style_name );

    /* freeing sbit size table */
    FT_FREE( face->root.available_sizes );
    FT_FREE( face->sbit_strike_map );
    face->root.num_fixed_sizes = 0;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    FT_FREE( face->postscript_name );
    FT_FREE( face->var_postscript_prefix );
#endif

    face->sfnt = NULL;
  }